

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O0

void __thiscall
tchecker::zg::details::local_lu_extrapolation_t::local_lu_extrapolation_t
          (local_lu_extrapolation_t *this,
          shared_ptr<const_tchecker::clockbounds::local_lu_map_t> *clock_bounds)

{
  clock_id_t cVar1;
  element_type *peVar2;
  map_t *pmVar3;
  shared_ptr<const_tchecker::clockbounds::local_lu_map_t> *clock_bounds_local;
  local_lu_extrapolation_t *this_local;
  
  extrapolation_t::extrapolation_t(&this->super_extrapolation_t);
  (this->super_extrapolation_t)._vptr_extrapolation_t =
       (_func_int **)&PTR__local_lu_extrapolation_t_003b4140;
  this->_l = (map_t *)0x0;
  this->_u = (map_t *)0x0;
  std::shared_ptr<const_tchecker::clockbounds::local_lu_map_t>::shared_ptr
            (&this->_clock_bounds,clock_bounds);
  peVar2 = std::
           __shared_ptr_access<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_clock_bounds);
  cVar1 = clockbounds::local_lu_map_t::clock_number(peVar2);
  pmVar3 = clockbounds::allocate_map((ulong)cVar1);
  this->_l = pmVar3;
  peVar2 = std::
           __shared_ptr_access<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_clock_bounds);
  cVar1 = clockbounds::local_lu_map_t::clock_number(peVar2);
  pmVar3 = clockbounds::allocate_map((ulong)cVar1);
  this->_u = pmVar3;
  return;
}

Assistant:

local_lu_extrapolation_t::local_lu_extrapolation_t(
    std::shared_ptr<tchecker::clockbounds::local_lu_map_t const> const & clock_bounds)
    : _l(nullptr), _u(nullptr), _clock_bounds(clock_bounds)
{
  _l = tchecker::clockbounds::allocate_map(_clock_bounds->clock_number());
  _u = tchecker::clockbounds::allocate_map(_clock_bounds->clock_number());
}